

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

CLayer * __thiscall CEditor::GetSelectedLayer(CEditor *this,int Index)

{
  int iVar1;
  CLayerGroup *pCVar2;
  
  pCVar2 = GetSelectedGroup(this);
  if (pCVar2 != (CLayerGroup *)0x0) {
    iVar1 = this->m_SelectedLayer;
    if ((-1 < (long)iVar1) &&
       (iVar1 < ((this->m_Map).m_lGroups.list[this->m_SelectedGroup]->m_lLayers).num_elements)) {
      return (pCVar2->m_lLayers).list[iVar1];
    }
  }
  return (CLayer *)0x0;
}

Assistant:

CLayer *CEditor::GetSelectedLayer(int Index)
{
	CLayerGroup *pGroup = GetSelectedGroup();
	if(!pGroup)
		return 0x0;

	if(m_SelectedLayer >= 0 && m_SelectedLayer < m_Map.m_lGroups[m_SelectedGroup]->m_lLayers.size())
		return pGroup->m_lLayers[m_SelectedLayer];
	return 0x0;
}